

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpClient.cpp
# Opt level: O1

void __thiscall Liby::http::HttpClient::sendRequest(HttpClient *this)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  _Node *p_Var3;
  size_t in_RCX;
  int in_R8D;
  Buffer buffer;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  Buffer local_38;
  
  p_Var2 = (this->requestLists_).
           super__List_base<std::pair<Liby::http::Request,_std::function<void_(Liby::http::Reply_&)>_>,_std::allocator<std::pair<Liby::http::Request,_std::function<void_(Liby::http::Reply_&)>_>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  Buffer::Buffer(&local_38,0x400);
  Request::toString_abi_cxx11_((string *)local_58,(Request *)(p_Var2 + 1));
  Buffer::append(&local_38,(string *)local_58);
  if ((undefined1 *)local_58._0_8_ != local_48) {
    operator_delete((void *)local_58._0_8_);
  }
  Buffer::append(&local_38,(Buffer *)(p_Var2 + 9));
  local_58._8_8_ = 0;
  local_48._8_8_ =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/http/HttpClient.cpp:68:30)>
       ::_M_invoke;
  local_48._0_8_ =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/http/HttpClient.cpp:68:30)>
       ::_M_manager;
  local_58._0_8_ = this;
  Connection::send((this->http_conn_).
                   super___shared_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                   (int)&local_38,local_58,in_RCX,in_R8D);
  if ((code *)local_48._0_8_ != (code *)0x0) {
    (*(code *)local_48._0_8_)(local_58,local_58,3);
  }
  p_Var3 = std::__cxx11::
           list<std::pair<Liby::http::Request,std::function<void(Liby::http::Reply&)>>,std::allocator<std::pair<Liby::http::Request,std::function<void(Liby::http::Reply&)>>>>
           ::
           _M_create_node<std::pair<Liby::http::Request,std::function<void(Liby::http::Reply&)>>const&>
                     ((list<std::pair<Liby::http::Request,std::function<void(Liby::http::Reply&)>>,std::allocator<std::pair<Liby::http::Request,std::function<void(Liby::http::Reply&)>>>>
                       *)&this->sendReqeustLists_,
                      (pair<Liby::http::Request,_std::function<void_(Liby::http::Reply_&)>_> *)
                      ((this->requestLists_).
                       super__List_base<std::pair<Liby::http::Request,_std::function<void_(Liby::http::Reply_&)>_>,_std::allocator<std::pair<Liby::http::Request,_std::function<void_(Liby::http::Reply_&)>_>_>_>
                       ._M_impl._M_node.super__List_node_base._M_next + 1));
  std::__detail::_List_node_base::_M_hook(&p_Var3->super__List_node_base);
  psVar1 = &(this->sendReqeustLists_).
            super__List_base<std::pair<Liby::http::Request,_std::function<void_(Liby::http::Reply_&)>_>,_std::allocator<std::pair<Liby::http::Request,_std::function<void_(Liby::http::Reply_&)>_>_>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  std::__cxx11::
  list<std::pair<Liby::http::Request,_std::function<void_(Liby::http::Reply_&)>_>,_std::allocator<std::pair<Liby::http::Request,_std::function<void_(Liby::http::Reply_&)>_>_>_>
  ::_M_erase(&this->requestLists_,
             (this->requestLists_).
             super__List_base<std::pair<Liby::http::Request,_std::function<void_(Liby::http::Reply_&)>_>,_std::allocator<std::pair<Liby::http::Request,_std::function<void_(Liby::http::Reply_&)>_>_>_>
             ._M_impl._M_node.super__List_node_base._M_next);
  Buffer::~Buffer(&local_38);
  return;
}

Assistant:

void HttpClient::sendRequest() {
    auto &request = requestLists_.front().first;
    Buffer buffer(1024);
    buffer.append(request.toString());
    buffer.append(request.body_);
    http_conn_->send(buffer, [this] {
        http_conn_->enableRead();
        if (requestLists_.empty())
            return;
        sendRequest();
    });
    sendReqeustLists_.push_back(requestLists_.front());
    requestLists_.pop_front();
}